

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * compile_iteration_abi_cxx11_
                   (string *__return_storage_ptr__,CLIArguments *args,
                   vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_file)

{
  InterfaceVariableRename *pIVar1;
  CombinedImageSampler *pCVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  ushort uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  undefined4 uVar19;
  ID id;
  uint *puVar20;
  pair<unsigned_int,_unsigned_int> *ppVar21;
  size_t sVar22;
  pointer pcVar23;
  size_t sVar24;
  pointer pPVar25;
  size_type sVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  FILE *pFVar32;
  _Alloc_hider _Var33;
  undefined8 uVar34;
  pointer pPVar35;
  pointer pPVar36;
  pointer pPVar37;
  pointer pPVar38;
  pointer pPVar39;
  pointer pPVar40;
  EntryPoint *pEVar41;
  bool bVar42;
  ExecutionModel model;
  int iVar43;
  int iVar44;
  uint uVar45;
  VariableID VVar46;
  CompilerMSL *this;
  string *psVar47;
  string *ts_1;
  Bitset *pBVar48;
  Resource *pRVar49;
  undefined8 extraout_RAX;
  undefined1 uVar50;
  uint32_t *puVar51;
  undefined1 uVar52;
  Options *pOVar53;
  bool *pbVar54;
  pair<unsigned_int,_unsigned_int> *v;
  pair<unsigned_int,_unsigned_int> *ppVar55;
  long lVar56;
  _Hash_node_base *p_Var57;
  SmallVector<spirv_cross::Resource,_8UL> *resources;
  ulong in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  Platform PVar58;
  uint32_t i;
  ulong uVar59;
  CompilerHLSL *hlsl_compiler;
  Resource *pRVar60;
  MSLShaderInput *v_1;
  MSLShaderInput *si;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  Remap *remap;
  InterfaceVariableRename *pIVar61;
  HLSLVertexAttributeRemap *vertex_attributes;
  byte bVar62;
  long lVar63;
  CombinedImageSampler *pCVar64;
  bool bVar65;
  bool bVar66;
  string entry_point;
  string *ret;
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
  active;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> pls_outputs;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> pls_inputs;
  SmallVector<spirv_cross::EntryPoint,_8UL> entry_points;
  ShaderResources res;
  SmallVector<spirv_cross::EntryPoint,_8UL> entry_points_1;
  Parser spirv_parser;
  string local_3108;
  string *local_30e8;
  string *local_30e0;
  undefined1 local_30d8 [24];
  __node_base_ptr local_30c0 [5];
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> local_3098;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> local_3078;
  anon_class_8_1_c430121d local_3060 [2];
  undefined1 local_3050 [40];
  Variant *local_3028;
  undefined1 local_3018 [16];
  function<void_(const_spirv_cross::SPIRType_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_3008;
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2fe8;
  SmallVector<spirv_cross::EntryPoint,_8UL> local_2fb0;
  undefined1 local_2e58 [408];
  undefined1 local_2cc0 [408];
  undefined1 local_2b28 [408];
  undefined1 local_2990 [408];
  undefined1 local_27f8 [408];
  undefined1 local_2660 [408];
  undefined1 local_24c8 [408];
  undefined1 local_2330 [408];
  undefined1 local_2198 [408];
  undefined1 local_2000 [408];
  undefined1 local_1e68 [408];
  undefined1 local_1cd0 [408];
  undefined1 local_1b38 [24];
  Resource local_1b20 [8];
  SmallVector<spirv_cross::Resource,_8UL> local_19a0;
  SmallVector<spirv_cross::Resource,_8UL> local_1808;
  SmallVector<spirv_cross::Resource,_8UL> local_1670;
  SmallVector<spirv_cross::Resource,_8UL> local_14d8;
  SmallVector<spirv_cross::Resource,_8UL> local_1340;
  SmallVector<spirv_cross::Resource,_8UL> local_11a8;
  SmallVector<spirv_cross::Resource,_8UL> local_1010;
  SmallVector<spirv_cross::Resource,_8UL> local_e78;
  SmallVector<spirv_cross::Resource,_8UL> local_ce0;
  SmallVector<spirv_cross::Resource,_8UL> local_b48;
  SmallVector<spirv_cross::Resource,_8UL> local_9b0;
  undefined1 local_818 [2024];
  
  local_3050._16_8_ =
       (spirv_file->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_3050._24_8_ =
       (spirv_file->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_3050._32_8_ =
       (spirv_file->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (spirv_file->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (spirv_file->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (spirv_file->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30e0 = __return_storage_ptr__;
  spirv_cross::Parser::Parser
            ((Parser *)local_818,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_3050 + 0x10));
  if ((pointer)local_3050._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_3050._16_8_);
  }
  spirv_cross::Parser::parse((Parser *)local_818);
  if (args->cpp == true) {
    this = (CompilerMSL *)operator_new(0x25a0);
    spirv_cross::CompilerGLSL::CompilerGLSL((CompilerGLSL *)this,(ParsedIR *)local_818);
    (this->super_CompilerGLSL).super_Compiler._vptr_Compiler =
         (_func_int **)&PTR__CompilerCPP_0035b800;
    (this->function_global_vars)._M_h._M_buckets = (__buckets_ptr)0x0;
    (this->function_global_vars)._M_h._M_bucket_count = 0;
    (this->function_global_vars)._M_h._M_buckets =
         (__buckets_ptr)&(this->function_global_vars)._M_h._M_element_count;
    (this->function_global_vars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x8;
    (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&(this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(this->inputs_by_location)._M_t._M_impl = 0;
    *(undefined1 *)&(this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = _S_red;
    (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)&(this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    *(undefined1 *)&(this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined4 *)&(this->inputs_by_builtin)._M_h._M_bucket_count = 0;
    (this->inputs_by_builtin)._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)&(this->inputs_by_builtin)._M_h._M_rehash_policy;
    (this->inputs_by_builtin)._M_h._M_element_count = 0;
    *(undefined1 *)&(this->inputs_by_builtin)._M_h._M_rehash_policy._M_max_load_factor = 0;
    if (args->cpp_interface_name != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_3028,args->cpp_interface_name,(allocator *)local_2e58);
      std::__cxx11::string::operator=
                ((string *)&(this->inputs_by_builtin)._M_h._M_before_begin,(string *)&local_3028);
      if (local_3028 != (Variant *)local_3018) {
        operator_delete(local_3028);
      }
    }
LAB_001a0956:
    bVar27 = false;
    bVar62 = 0;
  }
  else {
    if (args->msl == true) {
      this = (CompilerMSL *)operator_new(0x2b08);
      spirv_cross::CompilerMSL::CompilerMSL(this,(ParsedIR *)local_818);
      puVar51 = &args->msl_version;
      if (args->set_msl_version == false) {
        puVar51 = &(this->msl_options).msl_version;
      }
      uVar16 = *puVar51;
      bVar27 = args->msl_capture_output_to_buffer;
      bVar66 = args->msl_swizzle_texture_samples;
      bVar42 = args->msl_invariant_float_math;
      bVar65 = args->msl_ios == false;
      pbVar54 = &args->msl_framebuffer_fetch;
      if (bVar65) {
        pbVar54 = &(this->msl_options).ios_use_framebuffer_fetch_subpasses;
      }
      PVar58 = iOS;
      if (bVar65) {
        PVar58 = (this->msl_options).platform;
      }
      bVar11 = *pbVar54;
      pbVar54 = &args->msl_emulate_cube_array;
      if (bVar65) {
        pbVar54 = &(this->msl_options).emulate_cube_array;
      }
      bVar65 = *pbVar54;
      local_30e8 = (string *)CONCAT71(local_30e8._1_7_,bVar65);
      bVar12 = args->msl_pad_fragment_output;
      bVar13 = args->msl_domain_lower_left;
      bVar14 = args->msl_argument_buffers;
      bVar3 = args->msl_texture_buffer_native;
      bVar4 = args->msl_multiview;
      bVar30 = args->msl_multiview_layered_rendering;
      bVar31 = args->msl_view_index_from_device_index;
      bVar5 = args->msl_dispatch_base;
      bVar6 = args->msl_decoration_binding;
      bVar7 = args->msl_force_active_argument_buffer_resources;
      bVar8 = args->msl_force_native_arrays;
      bVar28 = args->msl_enable_frag_depth_builtin;
      bVar29 = args->msl_enable_frag_stencil_ref_builtin;
      uVar17 = args->msl_enable_frag_output_mask;
      bVar9 = args->msl_enable_clip_distance_user_varying;
      uVar15._0_1_ = args->msl_multi_patch_workgroup;
      uVar15._1_1_ = args->msl_vertex_for_tessellation;
      in_R8 = (ulong)uVar15;
      uVar18 = args->msl_additional_fixed_sample_mask;
      bVar10 = args->msl_arrayed_subpass_input;
      (this->msl_options).platform = PVar58;
      (this->msl_options).msl_version = uVar16;
      (this->msl_options).enable_frag_output_mask = uVar17;
      (this->msl_options).additional_fixed_sample_mask = uVar18;
      (this->msl_options).enable_frag_depth_builtin = bVar28;
      (this->msl_options).enable_frag_stencil_ref_builtin = bVar29;
      (this->msl_options).capture_output_to_buffer = bVar27;
      (this->msl_options).swizzle_texture_samples = bVar66;
      (this->msl_options).tess_domain_origin_lower_left = bVar13;
      (this->msl_options).multiview = bVar4;
      (this->msl_options).multiview_layered_rendering = bVar30;
      (this->msl_options).view_index_from_device_index = bVar31;
      (this->msl_options).dispatch_base = bVar5;
      (this->msl_options).argument_buffers = bVar14;
      (this->msl_options).pad_fragment_output_components = bVar12;
      (this->msl_options).ios_use_framebuffer_fetch_subpasses = bVar11;
      (this->msl_options).invariant_float_math = bVar42;
      (this->msl_options).emulate_cube_array = bVar65;
      (this->msl_options).enable_decoration_binding = bVar6;
      (this->msl_options).texture_buffer_native = bVar3;
      (this->msl_options).force_active_argument_buffer_resources = bVar7;
      (this->msl_options).force_native_arrays = bVar8;
      (this->msl_options).enable_clip_distance_user_varying = bVar9;
      (this->msl_options).multi_patch_workgroup = (bool)(undefined1)uVar15;
      (this->msl_options).vertex_for_tessellation = (bool)uVar15._1_1_;
      (this->msl_options).arrayed_subpass_input = bVar10;
      sVar22 = (args->msl_discrete_descriptor_sets).super_VectorView<unsigned_int>.buffer_size;
      if (sVar22 != 0) {
        puVar20 = (args->msl_discrete_descriptor_sets).super_VectorView<unsigned_int>.ptr;
        lVar56 = 0;
        do {
          spirv_cross::CompilerMSL::add_discrete_descriptor_set
                    (this,*(uint32_t *)((long)puVar20 + lVar56));
          lVar56 = lVar56 + 4;
        } while (sVar22 << 2 != lVar56);
      }
      sVar22 = (args->msl_device_argument_buffers).super_VectorView<unsigned_int>.buffer_size;
      if (sVar22 != 0) {
        puVar20 = (args->msl_device_argument_buffers).super_VectorView<unsigned_int>.ptr;
        lVar56 = 0;
        do {
          spirv_cross::CompilerMSL::set_argument_buffer_device_address_space
                    (this,*(uint32_t *)((long)puVar20 + lVar56),true);
          lVar56 = lVar56 + 4;
        } while (sVar22 << 2 != lVar56);
      }
      sVar22 = (args->msl_dynamic_buffers).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.
               buffer_size;
      if (sVar22 != 0) {
        ppVar21 = (args->msl_dynamic_buffers).
                  super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr;
        lVar56 = 0;
        do {
          spirv_cross::CompilerMSL::add_dynamic_buffer
                    (this,ppVar21[lVar56].first,ppVar21[lVar56].second,(uint32_t)lVar56);
          lVar63 = lVar56 + 1;
          lVar56 = lVar56 + 1;
        } while (ppVar21 + lVar63 != ppVar21 + sVar22);
      }
      sVar22 = (args->msl_inline_uniform_blocks).
               super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.buffer_size;
      if (sVar22 != 0) {
        ppVar55 = (args->msl_inline_uniform_blocks).
                  super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr;
        ppVar21 = ppVar55 + sVar22;
        do {
          spirv_cross::CompilerMSL::add_inline_uniform_block(this,ppVar55->first,ppVar55->second);
          ppVar55 = ppVar55 + 1;
        } while (ppVar55 != ppVar21);
      }
      sVar22 = (args->msl_shader_inputs).super_VectorView<spirv_cross::MSLShaderInput>.buffer_size;
      if (sVar22 != 0) {
        si = (args->msl_shader_inputs).super_VectorView<spirv_cross::MSLShaderInput>.ptr;
        lVar56 = sVar22 << 4;
        do {
          spirv_cross::CompilerMSL::add_msl_shader_input(this,si);
          si = si + 1;
          lVar56 = lVar56 + -0x10;
        } while (lVar56 != 0);
      }
      goto LAB_001a0956;
    }
    if (args->hlsl == true) {
      this = (CompilerMSL *)operator_new(0x2698);
      spirv_cross::CompilerHLSL::CompilerHLSL((CompilerHLSL *)this,(ParsedIR *)local_818);
      goto LAB_001a0956;
    }
    bVar42 = args->vulkan_semantics;
    if ((bVar42 == true) && (args->vulkan_glsl_disable_ext_samplerless_texture_functions != true)) {
      bVar27 = false;
    }
    else {
      bVar27 = true;
    }
    this = (CompilerMSL *)operator_new(0x2420);
    spirv_cross::CompilerGLSL::CompilerGLSL((CompilerGLSL *)this,(ParsedIR *)local_818);
    bVar62 = bVar42 ^ 1;
  }
  if ((args->variable_type_remaps).super_VectorView<VariableTypeRemap>.buffer_size != 0) {
    local_3008.super__Function_base._M_functor._8_8_ = 0;
    local_3008._M_invoker =
         std::
         _Function_handler<void_(const_spirv_cross::SPIRType_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1035:19)>
         ::_M_invoke;
    local_3008.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_spirv_cross::SPIRType_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1035:19)>
         ::_M_manager;
    local_3008.super__Function_base._M_functor._M_unused._M_object = args;
    std::
    function<void_(const_spirv_cross::SPIRType_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator=(&(this->super_CompilerGLSL).super_Compiler.variable_remap_callback,&local_3008);
    if (local_3008.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_3008.super__Function_base._M_manager)
                ((_Any_data *)&local_3008,(_Any_data *)&local_3008,__destroy_functor);
    }
  }
  sVar22 = (args->entry_point_rename).super_VectorView<CLIArguments::Rename>.buffer_size;
  if (sVar22 != 0) {
    psVar47 = &((args->entry_point_rename).super_VectorView<CLIArguments::Rename>.ptr)->new_name;
    lVar56 = sVar22 * 0x48;
    do {
      spirv_cross::Compiler::rename_entry_point
                ((Compiler *)this,psVar47 + -1,psVar47,
                 *(ExecutionModel *)&psVar47[1]._M_dataplus._M_p);
      psVar47 = (string *)&psVar47[2]._M_string_length;
      lVar56 = lVar56 + -0x48;
    } while (lVar56 != 0);
  }
  spirv_cross::Compiler::get_entry_points_and_stages(&local_2fb0,(Compiler *)this);
  local_3108._M_dataplus._M_p = (pointer)&local_3108.field_2;
  pcVar23 = (args->entry)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3108,pcVar23,pcVar23 + (args->entry)._M_string_length);
  if ((args->entry_stage)._M_string_length == 0) {
LAB_001a0b06:
    sVar26 = local_3108._M_string_length;
    _Var33._M_p = local_3108._M_dataplus._M_p;
    if (local_3108._M_string_length == 0) {
      model = ExecutionModelMax;
      goto LAB_001a0c07;
    }
    if (local_2fb0.super_VectorView<spirv_cross::EntryPoint>.buffer_size == 0) {
      model = ExecutionModelMax;
      iVar43 = 0;
    }
    else {
      lVar56 = 0;
      model = ExecutionModelMax;
      iVar43 = 0;
      do {
        sVar24 = *(size_t *)
                  ((long)&((local_2fb0.super_VectorView<spirv_cross::EntryPoint>.ptr)->name).
                          _M_string_length + lVar56);
        if ((sVar24 == sVar26) &&
           ((sVar24 == 0 ||
            (iVar44 = bcmp(*(void **)((long)&((local_2fb0.super_VectorView<spirv_cross::EntryPoint>.
                                              ptr)->name)._M_dataplus._M_p + lVar56),_Var33._M_p,
                           sVar24), iVar44 == 0)))) {
          iVar43 = iVar43 + 1;
          model = *(ExecutionModel *)
                   ((long)&(local_2fb0.super_VectorView<spirv_cross::EntryPoint>.ptr)->
                           execution_model + lVar56);
        }
        lVar56 = lVar56 + 0x28;
      } while (local_2fb0.super_VectorView<spirv_cross::EntryPoint>.buffer_size * 0x28 != lVar56);
    }
    if (iVar43 == 1) goto LAB_001a0c07;
    if (iVar43 == 0) {
      compile_iteration_abi_cxx11_();
LAB_001a0bee:
      std::__cxx11::string::_M_assign((string *)&local_3108);
      goto LAB_001a0bfb;
    }
  }
  else {
    psVar47 = &args->entry_stage;
    model = stage_to_execution_model(psVar47);
    pEVar41 = local_2fb0.super_VectorView<spirv_cross::EntryPoint>.ptr;
    sVar26 = local_3108._M_string_length;
    _Var33._M_p = local_3108._M_dataplus._M_p;
    if (local_3108._M_string_length == 0) {
      if (local_2fb0.super_VectorView<spirv_cross::EntryPoint>.buffer_size != 0) {
        lVar56 = local_2fb0.super_VectorView<spirv_cross::EntryPoint>.buffer_size * 0x28;
        do {
          if ((local_2fb0.super_VectorView<spirv_cross::EntryPoint>.ptr)->execution_model == model)
          goto LAB_001a0bee;
          local_2fb0.super_VectorView<spirv_cross::EntryPoint>.ptr =
               local_2fb0.super_VectorView<spirv_cross::EntryPoint>.ptr + 1;
          lVar56 = lVar56 + -0x28;
        } while (lVar56 != 0);
      }
LAB_001a0bfb:
      if (local_3108._M_string_length == 0) goto LAB_001a1d58;
    }
    else {
      local_30e8 = psVar47;
      if (local_2fb0.super_VectorView<spirv_cross::EntryPoint>.buffer_size == 0) {
LAB_001a0af7:
        compile_iteration_abi_cxx11_();
        goto LAB_001a0b06;
      }
      lVar56 = local_2fb0.super_VectorView<spirv_cross::EntryPoint>.buffer_size * 0x28;
      bVar42 = false;
      lVar63 = 0;
      do {
        if (((*(ExecutionModel *)((long)&pEVar41->execution_model + lVar63) == model) &&
            (sVar24 = *(size_t *)((long)&(pEVar41->name)._M_string_length + lVar63),
            sVar24 == sVar26)) &&
           ((sVar24 == 0 ||
            (iVar43 = bcmp(*(void **)((long)&(pEVar41->name)._M_dataplus._M_p + lVar63),_Var33._M_p,
                           sVar24), iVar43 == 0)))) {
          bVar42 = true;
          bVar66 = true;
        }
        else {
          bVar66 = false;
        }
      } while ((!bVar66) && (bVar66 = lVar56 + -0x28 != lVar63, lVar63 = lVar63 + 0x28, bVar66));
      if (!bVar42) goto LAB_001a0af7;
    }
LAB_001a0c07:
    if (local_3108._M_string_length != 0) {
      spirv_cross::Compiler::set_entry_point((Compiler *)this,&local_3108,model);
    }
    if ((args->set_version != false) || ((this->super_CompilerGLSL).options.version != 0)) {
      pOVar53 = (Options *)&args->version;
      if (args->set_version == false) {
        pOVar53 = &(this->super_CompilerGLSL).options;
      }
      pbVar54 = &args->es;
      if (args->set_es == false) {
        pbVar54 = &(this->super_CompilerGLSL).options.es;
      }
      bVar42 = *pbVar54;
      bVar66 = args->force_temporary;
      bVar65 = args->sso;
      bVar3 = args->flatten_multidimensional_arrays;
      bVar4 = args->use_420pack_extension;
      bVar11 = args->vulkan_semantics;
      ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71((int7)(in_R8 >> 8),bVar11);
      bVar9 = args->fixup;
      bVar10 = args->yflip;
      bVar12 = args->support_nonzero_baseinstance;
      bVar5 = args->glsl_emit_push_constant_as_ubo;
      bVar6 = args->glsl_emit_ubo_as_plain_uniforms;
      bVar13 = args->glsl_force_flattened_io_blocks;
      bVar7 = args->emit_line_directives;
      bVar8 = args->enable_storage_image_qualifier_deduction;
      bVar14 = args->force_zero_initialized_variables;
      (this->super_CompilerGLSL).options.version = pOVar53->version;
      (this->super_CompilerGLSL).options.es = bVar42;
      (this->super_CompilerGLSL).options.force_temporary = bVar66;
      (this->super_CompilerGLSL).options.vulkan_semantics = bVar11;
      (this->super_CompilerGLSL).options.separate_shader_objects = bVar65;
      (this->super_CompilerGLSL).options.flatten_multidimensional_arrays = bVar3;
      (this->super_CompilerGLSL).options.enable_420pack_extension = bVar4;
      (this->super_CompilerGLSL).options.emit_push_constant_as_uniform_buffer = bVar5;
      (this->super_CompilerGLSL).options.emit_uniform_buffer_as_plain_uniforms = bVar6;
      (this->super_CompilerGLSL).options.emit_line_directives = bVar7;
      (this->super_CompilerGLSL).options.enable_storage_image_qualifier_deduction = bVar8;
      (this->super_CompilerGLSL).options.force_zero_initialized_variables = bVar14;
      (this->super_CompilerGLSL).options.force_flattened_io_blocks = bVar13;
      (this->super_CompilerGLSL).options.vertex.fixup_clipspace = bVar9;
      (this->super_CompilerGLSL).options.vertex.flip_vert_y = bVar10;
      (this->super_CompilerGLSL).options.vertex.support_nonzero_base_instance = bVar12;
      sVar22 = (args->glsl_ext_framebuffer_fetch).
               super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.buffer_size;
      if (sVar22 != 0) {
        ppVar55 = (args->glsl_ext_framebuffer_fetch).
                  super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr;
        ppVar21 = ppVar55 + sVar22;
        do {
          spirv_cross::CompilerGLSL::remap_ext_framebuffer_fetch
                    (&this->super_CompilerGLSL,ppVar55->first,ppVar55->second);
          ppVar55 = ppVar55 + 1;
        } while (ppVar55 != ppVar21);
      }
      if (args->hlsl != false) {
        uVar50 = *(undefined1 *)&(this->function_global_vars)._M_h._M_buckets;
        uVar52 = *(undefined1 *)((long)&(this->function_global_vars)._M_h._M_buckets + 1);
        if (args->set_shader_model == true) {
          uVar45 = args->shader_model;
          if (uVar45 < 0x1e) {
            compile_iteration_abi_cxx11_();
            goto LAB_001a0dbe;
          }
        }
        else {
          uVar45 = *(uint *)&(this->super_CompilerGLSL).field_0x241c;
        }
        if (args->hlsl_compat != false) {
          uVar52 = 1;
          uVar50 = 1;
        }
        if (uVar45 < 0x1f) {
          bVar27 = true;
          bVar62 = 1;
        }
        uVar19 = *(undefined4 *)&args->hlsl_support_nonzero_base;
        *(uint *)&(this->super_CompilerGLSL).field_0x241c = uVar45;
        *(undefined1 *)&(this->function_global_vars)._M_h._M_buckets = uVar50;
        *(undefined1 *)((long)&(this->function_global_vars)._M_h._M_buckets + 1) = uVar52;
        *(undefined4 *)((long)&(this->function_global_vars)._M_h._M_buckets + 2) = uVar19;
        spirv_cross::CompilerHLSL::set_resource_binding_flags
                  ((CompilerHLSL *)this,args->hlsl_binding_flags);
      }
LAB_001a0dbe:
      if ((bVar27) &&
         (VVar46 = spirv_cross::Compiler::build_dummy_sampler_for_combined_images((Compiler *)this),
         VVar46.id != 0)) {
        spirv_cross::Compiler::set_decoration
                  ((Compiler *)this,(ID)VVar46.id,DecorationDescriptorSet,0);
        spirv_cross::Compiler::set_decoration((Compiler *)this,(ID)VVar46.id,DecorationBinding,0);
      }
      local_2e58._0_8_ = local_2e58 + 0x18;
      local_2e58._8_8_ = 0;
      local_2e58._16_8_ = 8;
      local_2cc0._0_8_ = local_2cc0 + 0x18;
      local_2cc0._8_8_ = 0;
      local_2cc0._16_8_ = (TypedID<(spirv_cross::Types)0> *)0x8;
      local_2b28._0_8_ = local_2b28 + 0x18;
      local_2b28._8_8_ = 0;
      local_2b28._16_8_ = 8;
      local_2990._0_8_ = local_2990 + 0x18;
      local_2990._8_8_ = 0;
      local_2990._16_8_ = 8;
      local_27f8._0_8_ = local_27f8 + 0x18;
      local_27f8._8_8_ = 0;
      local_27f8._16_8_ = 8;
      local_2660._0_8_ = local_2660 + 0x18;
      local_2660._8_8_ = 0;
      local_2660._16_8_ = (__node_base_ptr)0x8;
      local_24c8._0_8_ = local_24c8 + 0x18;
      local_24c8._8_8_ = (_Hash_node_base *)0x0;
      local_24c8._16_8_ = 8;
      local_2330._0_8_ = local_2330 + 0x18;
      local_2330._8_8_ = 0;
      local_2330._16_8_ = 8;
      local_2198._0_8_ = local_2198 + 0x18;
      local_2198._8_8_ = 0;
      local_2198._16_8_ = 8;
      local_2000._0_8_ = local_2000 + 0x18;
      local_2000._8_8_ = 0;
      local_2000._16_8_ = 8;
      local_1e68._0_8_ = local_1e68 + 0x18;
      local_1e68._8_8_ = 0;
      local_1e68._16_8_ = 8;
      local_1cd0._0_8_ = local_1cd0 + 0x18;
      local_1cd0._8_8_ = 0;
      local_1cd0._16_8_ = 8;
      if (args->remove_unused == true) {
        spirv_cross::Compiler::get_active_interface_variables
                  ((unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                    *)local_30d8,(Compiler *)this);
        spirv_cross::Compiler::get_shader_resources
                  ((ShaderResources *)local_1b38,(Compiler *)this,
                   (unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                    *)local_30d8);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2e58,
                   (SmallVector<spirv_cross::Resource,_8UL> *)local_1b38);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2cc0,&local_19a0);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2b28,&local_1808);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2990,&local_1670);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_27f8,&local_14d8);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2660,&local_1340);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_24c8,&local_11a8);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2330,&local_1010);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2198,&local_e78);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2000,&local_ce0);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_1e68,&local_b48);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_1cd0,&local_9b0);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_9b0);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_b48);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_ce0);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_e78);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1010);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_11a8);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1340);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_14d8);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1670);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1808);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_19a0);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_1b38);
        std::
        _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::_Hashtable(&local_2fe8,local_30d8);
        spirv_cross::Compiler::set_enabled_interface_variables
                  ((Compiler *)this,
                   (unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                    *)&local_2fe8);
        std::
        _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_2fe8);
        std::
        _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_30d8);
      }
      else {
        spirv_cross::Compiler::get_shader_resources((ShaderResources *)local_1b38,(Compiler *)this);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2e58,
                   (SmallVector<spirv_cross::Resource,_8UL> *)local_1b38);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2cc0,&local_19a0);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2b28,&local_1808);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2990,&local_1670);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_27f8,&local_14d8);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2660,&local_1340);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_24c8,&local_11a8);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2330,&local_1010);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2198,&local_e78);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_2000,&local_ce0);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_1e68,&local_b48);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_1cd0,&local_9b0);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_9b0);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_b48);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_ce0);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_e78);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1010);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_11a8);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1340);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_14d8);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1670);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1808);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_19a0);
        spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector
                  ((SmallVector<spirv_cross::Resource,_8UL> *)local_1b38);
      }
      uVar34 = local_2e58._0_8_;
      if (args->flatten_ubo == true) {
        if (local_2e58._8_8_ != 0) {
          lVar56 = local_2e58._8_8_ * 0x30;
          lVar63 = 0;
          do {
            spirv_cross::CompilerGLSL::flatten_buffer_block
                      (&this->super_CompilerGLSL,
                       (VariableID)*(uint32_t *)((long)&((ID *)uVar34)->id + lVar63));
            lVar63 = lVar63 + 0x30;
          } while (lVar56 != lVar63);
        }
        uVar34 = local_2000._0_8_;
        if (local_2000._8_8_ != 0) {
          lVar56 = local_2000._8_8_ * 0x30;
          lVar63 = 0;
          do {
            spirv_cross::CompilerGLSL::flatten_buffer_block
                      (&this->super_CompilerGLSL,
                       (VariableID)*(uint32_t *)((long)&((ID *)uVar34)->id + lVar63));
            lVar63 = lVar63 + 0x30;
          } while (lVar56 != lVar63);
        }
      }
      remap_pls(&local_3078,&args->pls_in,(SmallVector<spirv_cross::Resource,_8UL> *)local_2b28,
                (SmallVector<spirv_cross::Resource,_8UL> *)local_27f8);
      remap_pls(&local_3098,&args->pls_out,(SmallVector<spirv_cross::Resource,_8UL> *)local_2990,
                (SmallVector<spirv_cross::Resource,_8UL> *)0x0);
      pPVar40 = local_3078.
                super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      pPVar39 = local_3078.
                super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pPVar38 = local_3078.
                super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar37 = local_3098.
                super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      pPVar36 = local_3098.
                super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pPVar35 = local_3098.
                super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_3078.super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3078.super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3078.super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3098.super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3098.super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3098.super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pPVar25 = (this->super_CompilerGLSL).pls_inputs.
                super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
                _M_impl.super__Vector_impl_data._M_start;
      (this->super_CompilerGLSL).pls_inputs.
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_start = pPVar38;
      (this->super_CompilerGLSL).pls_inputs.
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_finish = pPVar39;
      (this->super_CompilerGLSL).pls_inputs.
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pPVar40;
      if (pPVar25 != (pointer)0x0) {
        operator_delete(pPVar25);
      }
      pPVar25 = (this->super_CompilerGLSL).pls_outputs.
                super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
                _M_impl.super__Vector_impl_data._M_start;
      (this->super_CompilerGLSL).pls_outputs.
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_start = pPVar35;
      (this->super_CompilerGLSL).pls_outputs.
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_finish = pPVar36;
      (this->super_CompilerGLSL).pls_outputs.
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pPVar37;
      if (pPVar25 != (pointer)0x0) {
        operator_delete(pPVar25);
      }
      spirv_cross::CompilerGLSL::remap_pls_variables(&this->super_CompilerGLSL);
      sVar22 = (args->extensions).
               super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .buffer_size;
      if (sVar22 != 0) {
        ext = (args->extensions).
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr;
        lVar56 = sVar22 << 5;
        do {
          spirv_cross::CompilerGLSL::require_extension(&this->super_CompilerGLSL,ext);
          ext = ext + 1;
          lVar56 = lVar56 + -0x20;
        } while (lVar56 != 0);
      }
      sVar22 = (args->remaps).super_VectorView<Remap>.buffer_size;
      if (sVar22 != 0) {
        remap = (args->remaps).super_VectorView<Remap>.ptr;
        lVar56 = sVar22 * 0x48;
        do {
          bVar42 = remap_generic((Compiler *)this,
                                 (SmallVector<spirv_cross::Resource,_8UL> *)local_2b28,remap);
          if ((!bVar42) &&
             (bVar42 = remap_generic((Compiler *)this,
                                     (SmallVector<spirv_cross::Resource,_8UL> *)local_2990,remap),
             !bVar42)) {
            remap_generic((Compiler *)this,(SmallVector<spirv_cross::Resource,_8UL> *)local_27f8,
                          remap);
          }
          remap = remap + 1;
          lVar56 = lVar56 + -0x48;
        } while (lVar56 != 0);
      }
      sVar22 = (args->interface_variable_renames).super_VectorView<InterfaceVariableRename>.
               buffer_size;
      if (sVar22 != 0) {
        pIVar61 = (args->interface_variable_renames).super_VectorView<InterfaceVariableRename>.ptr;
        pIVar1 = pIVar61 + sVar22;
        do {
          resources = (SmallVector<spirv_cross::Resource,_8UL> *)local_2b28;
          if (pIVar61->storageClass != StorageClassInput) {
            if (pIVar61->storageClass != StorageClassOutput) {
              compile_iteration_abi_cxx11_();
              goto LAB_001a1d4e;
            }
            resources = (SmallVector<spirv_cross::Resource,_8UL> *)local_2990;
          }
          spirv_cross_util::rename_interface_variable
                    ((Compiler *)this,resources,pIVar61->location,&pIVar61->variable_name);
          pIVar61 = pIVar61 + 1;
        } while (pIVar61 != pIVar1);
      }
      if (bVar62 != 0) {
        spirv_cross::Compiler::build_combined_image_samplers((Compiler *)this);
        if (args->combined_samplers_inherit_bindings == true) {
          spirv_cross_util::inherit_combined_sampler_bindings((Compiler *)this);
        }
        sVar22 = (this->super_CompilerGLSL).super_Compiler.combined_image_samplers.
                 super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size;
        if (sVar22 != 0) {
          pCVar64 = (this->super_CompilerGLSL).super_Compiler.combined_image_samplers.
                    super_VectorView<spirv_cross::CombinedImageSampler>.ptr;
          pCVar2 = pCVar64 + sVar22;
          do {
            id.id = (pCVar64->combined_id).id;
            psVar47 = spirv_cross::Compiler::get_name_abi_cxx11_
                                ((Compiler *)this,(ID)(pCVar64->image_id).id);
            ts_1 = spirv_cross::Compiler::get_name_abi_cxx11_
                             ((Compiler *)this,(ID)(pCVar64->sampler_id).id);
            spirv_cross::
            join<char_const(&)[21],std::__cxx11::string_const&,std::__cxx11::string_const&>
                      ((string *)local_1b38,(spirv_cross *)"SPIRV_Cross_Combined",
                       (char (*) [21])psVar47,ts_1,ts_2);
            spirv_cross::Compiler::set_name((Compiler *)this,id,(string *)local_1b38);
            if ((Resource *)local_1b38._0_8_ != (Resource *)(local_1b38 + 0x10)) {
              operator_delete((void *)local_1b38._0_8_);
            }
            pCVar64 = pCVar64 + 1;
          } while (pCVar64 != pCVar2);
        }
      }
      if ((args->hlsl == true) &&
         (VVar46 = spirv_cross::CompilerHLSL::remap_num_workgroups_builtin((CompilerHLSL *)this),
         VVar46.id != 0)) {
        spirv_cross::Compiler::set_decoration
                  ((Compiler *)this,(ID)VVar46.id,DecorationDescriptorSet,0);
        spirv_cross::Compiler::set_decoration((Compiler *)this,(ID)VVar46.id,DecorationBinding,0);
      }
      if ((args->hlsl == true) &&
         (sVar22 = (args->hlsl_attr_remap).super_VectorView<spirv_cross::HLSLVertexAttributeRemap>.
                   buffer_size, sVar22 != 0)) {
        vertex_attributes =
             (args->hlsl_attr_remap).super_VectorView<spirv_cross::HLSLVertexAttributeRemap>.ptr;
        lVar56 = sVar22 * 0x28;
        do {
          spirv_cross::CompilerHLSL::add_vertex_attribute_remap
                    ((CompilerHLSL *)this,vertex_attributes);
          vertex_attributes = vertex_attributes + 1;
          lVar56 = lVar56 + -0x28;
        } while (lVar56 != 0);
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[2])(local_30e0,this);
      if (args->dump_resources == true) {
        pBVar48 = spirv_cross::Compiler::get_execution_mode_bitset((Compiler *)this);
        fwrite("Entry points:\n",0xe,1,_stderr);
        spirv_cross::Compiler::get_entry_points_and_stages
                  ((SmallVector<spirv_cross::EntryPoint,_8UL> *)local_1b38,(Compiler *)this);
        if (local_1b38._8_8_ != 0) {
          compile_iteration_abi_cxx11_();
        }
        fputc(10,_stderr);
        fwrite("Execution modes:\n",0x11,1,_stderr);
        uVar59 = 0;
        local_3060[0].compiler = (Compiler *)this;
        do {
          if ((pBVar48->lower >> (uVar59 & 0x3f) & 1) != 0) {
            print_resources::anon_class_8_1_c430121d::operator()(local_3060,(uint32_t)uVar59);
          }
          uVar59 = uVar59 + 1;
        } while (uVar59 != 0x40);
        sVar22 = (pBVar48->higher)._M_h._M_element_count;
        if (sVar22 != 0) {
          local_30d8._8_8_ = 0;
          local_30d8._16_8_ = (_Hash_node_base *)0x8;
          local_30d8._0_8_ = local_30c0;
          spirv_cross::SmallVector<unsigned_int,_8UL>::reserve
                    ((SmallVector<unsigned_int,_8UL> *)local_30d8,sVar22);
          p_Var57 = (pBVar48->higher)._M_h._M_before_begin._M_nxt;
          if (p_Var57 != (_Hash_node_base *)0x0) {
            do {
              spirv_cross::SmallVector<unsigned_int,_8UL>::reserve
                        ((SmallVector<unsigned_int,_8UL> *)local_30d8,local_30d8._8_8_ + 1);
              *(undefined4 *)(local_30d8._0_8_ + local_30d8._8_8_ * 4) =
                   *(undefined4 *)&p_Var57[1]._M_nxt;
              local_30d8._8_8_ = local_30d8._8_8_ + 1;
              p_Var57 = p_Var57->_M_nxt;
            } while (p_Var57 != (_Hash_node_base *)0x0);
          }
          uVar34 = local_30d8._0_8_;
          if (local_30d8._8_8_ != 0) {
            pcVar23 = (pointer)(local_30d8._0_8_ + local_30d8._8_8_ * 4);
            lVar56 = 0x3f;
            if (local_30d8._8_8_ != 0) {
              for (; (ulong)local_30d8._8_8_ >> lVar56 == 0; lVar56 = lVar56 + -1) {
              }
            }
            std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_30d8._0_8_,pcVar23,((uint)lVar56 ^ 0x3f) * 2 ^ 0x7e);
            std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                      (uVar34,pcVar23);
          }
          uVar34 = local_30d8._0_8_;
          if (local_30d8._8_8_ != 0) {
            lVar56 = local_30d8._8_8_ << 2;
            lVar63 = 0;
            do {
              print_resources::anon_class_8_1_c430121d::operator()
                        (local_3060,*(uint32_t *)(uVar34 + lVar63));
              lVar63 = lVar63 + 4;
            } while (lVar56 != lVar63);
          }
          local_30d8._8_8_ = 0;
          if ((__node_base_ptr *)local_30d8._0_8_ != local_30c0) {
            free((void *)local_30d8._0_8_);
          }
        }
        fputc(10,_stderr);
        print_resources((Compiler *)this,"subpass inputs",
                        (SmallVector<spirv_cross::Resource,_8UL> *)local_27f8);
        print_resources((Compiler *)this,"inputs",
                        (SmallVector<spirv_cross::Resource,_8UL> *)local_2b28);
        print_resources((Compiler *)this,"outputs",
                        (SmallVector<spirv_cross::Resource,_8UL> *)local_2990);
        print_resources((Compiler *)this,"textures",
                        (SmallVector<spirv_cross::Resource,_8UL> *)local_24c8);
        print_resources((Compiler *)this,"separate images",
                        (SmallVector<spirv_cross::Resource,_8UL> *)local_1e68);
        print_resources((Compiler *)this,"separate samplers",
                        (SmallVector<spirv_cross::Resource,_8UL> *)local_1cd0);
        print_resources((Compiler *)this,"images",
                        (SmallVector<spirv_cross::Resource,_8UL> *)local_2660);
        print_resources((Compiler *)this,"ssbos",
                        (SmallVector<spirv_cross::Resource,_8UL> *)local_2cc0);
        print_resources((Compiler *)this,"ubos",
                        (SmallVector<spirv_cross::Resource,_8UL> *)local_2e58);
        print_resources((Compiler *)this,"push",
                        (SmallVector<spirv_cross::Resource,_8UL> *)local_2000);
        print_resources((Compiler *)this,"counters",
                        (SmallVector<spirv_cross::Resource,_8UL> *)local_2330);
        print_resources((Compiler *)this,"acceleration structures",
                        (SmallVector<spirv_cross::Resource,_8UL> *)local_2198);
        spirv_cross::SmallVector<spirv_cross::EntryPoint,_8UL>::~SmallVector
                  ((SmallVector<spirv_cross::EntryPoint,_8UL> *)local_1b38);
        if (local_2000._8_8_ != 0) {
          pRVar49 = (Resource *)(local_2000._0_8_ + local_2000._8_8_ * 0x30);
          pRVar60 = (Resource *)local_2000._0_8_;
          do {
            spirv_cross::Compiler::get_active_buffer_ranges
                      ((SmallVector<spirv_cross::BufferRange,_8UL> *)local_1b38,(Compiler *)this,
                       (VariableID)(pRVar60->id).id);
            pFVar32 = _stderr;
            sVar26 = (pRVar60->name)._M_string_length;
            if (sVar26 == 0) {
              psVar47 = (string *)local_30d8;
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[3])
                        (psVar47,this,(ulong)(pRVar60->id).id);
            }
            else {
              psVar47 = &pRVar60->name;
            }
            fprintf(pFVar32,"Active members in buffer: %s\n",(psVar47->_M_dataplus)._M_p);
            if ((sVar26 == 0) && ((undefined1 *)local_30d8._0_8_ != local_30d8 + 0x10)) {
              operator_delete((void *)local_30d8._0_8_);
            }
            fwrite("==================\n\n",0x14,1,_stderr);
            uVar34 = local_1b38._0_8_;
            if (local_1b38._8_8_ != 0) {
              lVar56 = local_1b38._8_8_ * 0x18;
              lVar63 = 0;
              do {
                psVar47 = spirv_cross::Compiler::get_member_name_abi_cxx11_
                                    ((Compiler *)this,(TypeID)(pRVar60->base_type_id).id,
                                     *(uint32_t *)(uVar34 + lVar63));
                pFVar32 = _stderr;
                uVar45 = *(uint *)(uVar34 + lVar63);
                if (psVar47->_M_string_length == 0) {
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[5])
                            (local_3060,this,(ulong)*(uint *)(uVar34 + lVar63));
                  fprintf(pFVar32,"Member #%3u (%s): Offset: %4u, Range: %4u\n",(ulong)uVar45,
                          local_3060[0].compiler,(ulong)*(uint *)(uVar34 + lVar63 + 8),
                          (ulong)*(uint *)(uVar34 + lVar63 + 0x10));
                  if ((CompilerMSL *)local_3060[0].compiler != (CompilerMSL *)local_3050) {
                    operator_delete(local_3060[0].compiler);
                  }
                }
                else {
                  fprintf(_stderr,"Member #%3u (%s): Offset: %4u, Range: %4u\n",(ulong)uVar45,
                          (psVar47->_M_dataplus)._M_p,(ulong)*(uint *)(uVar34 + lVar63 + 8),
                          (ulong)*(uint *)(uVar34 + lVar63 + 0x10));
                }
                lVar63 = lVar63 + 0x18;
              } while (lVar56 != lVar63);
            }
            fwrite("==================\n\n",0x14,1,_stderr);
            local_1b38._8_8_ = 0;
            if ((Resource *)local_1b38._0_8_ != local_1b20) {
              free((void *)local_1b38._0_8_);
            }
            pRVar60 = pRVar60 + 1;
          } while (pRVar60 != pRVar49);
        }
        spirv_cross::Compiler::get_specialization_constants
                  ((SmallVector<spirv_cross::SpecializationConstant,_8UL> *)local_1b38,
                   (Compiler *)this);
        compile_iteration_abi_cxx11_();
        fwrite("Capabilities\n",0xd,1,_stderr);
        fwrite("============\n",0xd,1,_stderr);
        spirv_cross::Compiler::get_declared_capabilities((Compiler *)this);
        compile_iteration_abi_cxx11_();
        fwrite("============\n\n",0xe,1,_stderr);
        fwrite("Extensions\n",0xb,1,_stderr);
        fwrite("============\n",0xd,1,_stderr);
        spirv_cross::Compiler::get_declared_extensions_abi_cxx11_((Compiler *)this);
        compile_iteration_abi_cxx11_();
      }
      if (local_3098.
          super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3098.
                        super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_3078.
          super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3078.
                        super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::Resource,_8UL> *)local_1cd0);
      spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::Resource,_8UL> *)local_1e68);
      spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::Resource,_8UL> *)local_2000);
      spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::Resource,_8UL> *)local_2198);
      spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::Resource,_8UL> *)local_2330);
      spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::Resource,_8UL> *)local_24c8);
      spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::Resource,_8UL> *)local_2660);
      spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::Resource,_8UL> *)local_27f8);
      spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::Resource,_8UL> *)local_2990);
      spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::Resource,_8UL> *)local_2b28);
      spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::Resource,_8UL> *)local_2cc0);
      spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::Resource,_8UL> *)local_2e58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3108._M_dataplus._M_p != &local_3108.field_2) {
        operator_delete(local_3108._M_dataplus._M_p);
      }
      spirv_cross::SmallVector<spirv_cross::EntryPoint,_8UL>::~SmallVector(&local_2fb0);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[1])(this);
      local_818._1944_8_ = 0;
      if ((pair<unsigned_int,_unsigned_int> *)local_818._1936_8_ !=
          (pair<unsigned_int,_unsigned_int> *)(local_818 + 0x7a8)) {
        free((void *)local_818._1936_8_);
      }
      local_818._1888_8_ = 0;
      if ((undefined1 *)local_818._1880_8_ != local_818 + 0x770) {
        free((void *)local_818._1880_8_);
      }
      spirv_cross::ParsedIR::~ParsedIR((ParsedIR *)local_818);
      return local_30e0;
    }
LAB_001a1d4e:
    compile_iteration_abi_cxx11_();
  }
  compile_iteration_abi_cxx11_();
LAB_001a1d58:
  compile_iteration_abi_cxx11_();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3108._M_dataplus._M_p != &local_3108.field_2) {
    operator_delete(local_3108._M_dataplus._M_p);
  }
  spirv_cross::SmallVector<spirv_cross::EntryPoint,_8UL>::~SmallVector(&local_2fb0);
  if (this != (CompilerMSL *)0x0) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[1])(this);
  }
  spirv_cross::Parser::~Parser((Parser *)local_818);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static string compile_iteration(const CLIArguments &args, std::vector<uint32_t> spirv_file)
{
	Parser spirv_parser(move(spirv_file));
	spirv_parser.parse();

	unique_ptr<CompilerGLSL> compiler;
	bool combined_image_samplers = false;
	bool build_dummy_sampler = false;

	if (args.cpp)
	{
		compiler.reset(new CompilerCPP(move(spirv_parser.get_parsed_ir())));
		if (args.cpp_interface_name)
			static_cast<CompilerCPP *>(compiler.get())->set_interface_name(args.cpp_interface_name);
	}
	else if (args.msl)
	{
		compiler.reset(new CompilerMSL(move(spirv_parser.get_parsed_ir())));

		auto *msl_comp = static_cast<CompilerMSL *>(compiler.get());
		auto msl_opts = msl_comp->get_msl_options();
		if (args.set_msl_version)
			msl_opts.msl_version = args.msl_version;
		msl_opts.capture_output_to_buffer = args.msl_capture_output_to_buffer;
		msl_opts.swizzle_texture_samples = args.msl_swizzle_texture_samples;
		msl_opts.invariant_float_math = args.msl_invariant_float_math;
		if (args.msl_ios)
		{
			msl_opts.platform = CompilerMSL::Options::iOS;
			msl_opts.ios_use_framebuffer_fetch_subpasses = args.msl_framebuffer_fetch;
			msl_opts.emulate_cube_array = args.msl_emulate_cube_array;
		}
		msl_opts.pad_fragment_output_components = args.msl_pad_fragment_output;
		msl_opts.tess_domain_origin_lower_left = args.msl_domain_lower_left;
		msl_opts.argument_buffers = args.msl_argument_buffers;
		msl_opts.texture_buffer_native = args.msl_texture_buffer_native;
		msl_opts.multiview = args.msl_multiview;
		msl_opts.multiview_layered_rendering = args.msl_multiview_layered_rendering;
		msl_opts.view_index_from_device_index = args.msl_view_index_from_device_index;
		msl_opts.dispatch_base = args.msl_dispatch_base;
		msl_opts.enable_decoration_binding = args.msl_decoration_binding;
		msl_opts.force_active_argument_buffer_resources = args.msl_force_active_argument_buffer_resources;
		msl_opts.force_native_arrays = args.msl_force_native_arrays;
		msl_opts.enable_frag_depth_builtin = args.msl_enable_frag_depth_builtin;
		msl_opts.enable_frag_stencil_ref_builtin = args.msl_enable_frag_stencil_ref_builtin;
		msl_opts.enable_frag_output_mask = args.msl_enable_frag_output_mask;
		msl_opts.enable_clip_distance_user_varying = args.msl_enable_clip_distance_user_varying;
		msl_opts.multi_patch_workgroup = args.msl_multi_patch_workgroup;
		msl_opts.vertex_for_tessellation = args.msl_vertex_for_tessellation;
		msl_opts.additional_fixed_sample_mask = args.msl_additional_fixed_sample_mask;
		msl_opts.arrayed_subpass_input = args.msl_arrayed_subpass_input;
		msl_comp->set_msl_options(msl_opts);
		for (auto &v : args.msl_discrete_descriptor_sets)
			msl_comp->add_discrete_descriptor_set(v);
		for (auto &v : args.msl_device_argument_buffers)
			msl_comp->set_argument_buffer_device_address_space(v, true);
		uint32_t i = 0;
		for (auto &v : args.msl_dynamic_buffers)
			msl_comp->add_dynamic_buffer(v.first, v.second, i++);
		for (auto &v : args.msl_inline_uniform_blocks)
			msl_comp->add_inline_uniform_block(v.first, v.second);
		for (auto &v : args.msl_shader_inputs)
			msl_comp->add_msl_shader_input(v);
	}
	else if (args.hlsl)
		compiler.reset(new CompilerHLSL(move(spirv_parser.get_parsed_ir())));
	else
	{
		combined_image_samplers = !args.vulkan_semantics;
		if (!args.vulkan_semantics || args.vulkan_glsl_disable_ext_samplerless_texture_functions)
			build_dummy_sampler = true;
		compiler.reset(new CompilerGLSL(move(spirv_parser.get_parsed_ir())));
	}

	if (!args.variable_type_remaps.empty())
	{
		auto remap_cb = [&](const SPIRType &, const string &name, string &out) -> void {
			for (const VariableTypeRemap &remap : args.variable_type_remaps)
				if (name == remap.variable_name)
					out = remap.new_variable_type;
		};

		compiler->set_variable_type_remap_callback(move(remap_cb));
	}

	for (auto &rename : args.entry_point_rename)
		compiler->rename_entry_point(rename.old_name, rename.new_name, rename.execution_model);

	auto entry_points = compiler->get_entry_points_and_stages();
	auto entry_point = args.entry;
	ExecutionModel model = ExecutionModelMax;

	if (!args.entry_stage.empty())
	{
		model = stage_to_execution_model(args.entry_stage);
		if (entry_point.empty())
		{
			// Just use the first entry point with this stage.
			for (auto &e : entry_points)
			{
				if (e.execution_model == model)
				{
					entry_point = e.name;
					break;
				}
			}

			if (entry_point.empty())
			{
				fprintf(stderr, "Could not find an entry point with stage: %s\n", args.entry_stage.c_str());
				exit(EXIT_FAILURE);
			}
		}
		else
		{
			// Make sure both stage and name exists.
			bool exists = false;
			for (auto &e : entry_points)
			{
				if (e.execution_model == model && e.name == entry_point)
				{
					exists = true;
					break;
				}
			}

			if (!exists)
			{
				fprintf(stderr, "Could not find an entry point %s with stage: %s\n", entry_point.c_str(),
				        args.entry_stage.c_str());
				exit(EXIT_FAILURE);
			}
		}
	}
	else if (!entry_point.empty())
	{
		// Make sure there is just one entry point with this name, or the stage
		// is ambiguous.
		uint32_t stage_count = 0;
		for (auto &e : entry_points)
		{
			if (e.name == entry_point)
			{
				stage_count++;
				model = e.execution_model;
			}
		}

		if (stage_count == 0)
		{
			fprintf(stderr, "There is no entry point with name: %s\n", entry_point.c_str());
			exit(EXIT_FAILURE);
		}
		else if (stage_count > 1)
		{
			fprintf(stderr, "There is more than one entry point with name: %s. Use --stage.\n", entry_point.c_str());
			exit(EXIT_FAILURE);
		}
	}

	if (!entry_point.empty())
		compiler->set_entry_point(entry_point, model);

	if (!args.set_version && !compiler->get_common_options().version)
	{
		fprintf(stderr, "Didn't specify GLSL version and SPIR-V did not specify language.\n");
		print_help();
		exit(EXIT_FAILURE);
	}

	CompilerGLSL::Options opts = compiler->get_common_options();
	if (args.set_version)
		opts.version = args.version;
	if (args.set_es)
		opts.es = args.es;
	opts.force_temporary = args.force_temporary;
	opts.separate_shader_objects = args.sso;
	opts.flatten_multidimensional_arrays = args.flatten_multidimensional_arrays;
	opts.enable_420pack_extension = args.use_420pack_extension;
	opts.vulkan_semantics = args.vulkan_semantics;
	opts.vertex.fixup_clipspace = args.fixup;
	opts.vertex.flip_vert_y = args.yflip;
	opts.vertex.support_nonzero_base_instance = args.support_nonzero_baseinstance;
	opts.emit_push_constant_as_uniform_buffer = args.glsl_emit_push_constant_as_ubo;
	opts.emit_uniform_buffer_as_plain_uniforms = args.glsl_emit_ubo_as_plain_uniforms;
	opts.force_flattened_io_blocks = args.glsl_force_flattened_io_blocks;
	opts.emit_line_directives = args.emit_line_directives;
	opts.enable_storage_image_qualifier_deduction = args.enable_storage_image_qualifier_deduction;
	opts.force_zero_initialized_variables = args.force_zero_initialized_variables;
	compiler->set_common_options(opts);

	for (auto &fetch : args.glsl_ext_framebuffer_fetch)
		compiler->remap_ext_framebuffer_fetch(fetch.first, fetch.second);

	// Set HLSL specific options.
	if (args.hlsl)
	{
		auto *hlsl = static_cast<CompilerHLSL *>(compiler.get());
		auto hlsl_opts = hlsl->get_hlsl_options();
		if (args.set_shader_model)
		{
			if (args.shader_model < 30)
			{
				fprintf(stderr, "Shader model earlier than 30 (3.0) not supported.\n");
				exit(EXIT_FAILURE);
			}

			hlsl_opts.shader_model = args.shader_model;
		}

		if (args.hlsl_compat)
		{
			// Enable all compat options.
			hlsl_opts.point_size_compat = true;
			hlsl_opts.point_coord_compat = true;
		}

		if (hlsl_opts.shader_model <= 30)
		{
			combined_image_samplers = true;
			build_dummy_sampler = true;
		}

		hlsl_opts.support_nonzero_base_vertex_base_instance = args.hlsl_support_nonzero_base;
		hlsl_opts.force_storage_buffer_as_uav = args.hlsl_force_storage_buffer_as_uav;
		hlsl_opts.nonwritable_uav_texture_as_srv = args.hlsl_nonwritable_uav_texture_as_srv;
		hlsl_opts.enable_16bit_types = args.hlsl_enable_16bit_types;
		hlsl->set_hlsl_options(hlsl_opts);
		hlsl->set_resource_binding_flags(args.hlsl_binding_flags);
	}

	if (build_dummy_sampler)
	{
		uint32_t sampler = compiler->build_dummy_sampler_for_combined_images();
		if (sampler != 0)
		{
			// Set some defaults to make validation happy.
			compiler->set_decoration(sampler, DecorationDescriptorSet, 0);
			compiler->set_decoration(sampler, DecorationBinding, 0);
		}
	}

	ShaderResources res;
	if (args.remove_unused)
	{
		auto active = compiler->get_active_interface_variables();
		res = compiler->get_shader_resources(active);
		compiler->set_enabled_interface_variables(move(active));
	}
	else
		res = compiler->get_shader_resources();

	if (args.flatten_ubo)
	{
		for (auto &ubo : res.uniform_buffers)
			compiler->flatten_buffer_block(ubo.id);
		for (auto &ubo : res.push_constant_buffers)
			compiler->flatten_buffer_block(ubo.id);
	}

	auto pls_inputs = remap_pls(args.pls_in, res.stage_inputs, &res.subpass_inputs);
	auto pls_outputs = remap_pls(args.pls_out, res.stage_outputs, nullptr);
	compiler->remap_pixel_local_storage(move(pls_inputs), move(pls_outputs));

	for (auto &ext : args.extensions)
		compiler->require_extension(ext);

	for (auto &remap : args.remaps)
	{
		if (remap_generic(*compiler, res.stage_inputs, remap))
			continue;
		if (remap_generic(*compiler, res.stage_outputs, remap))
			continue;
		if (remap_generic(*compiler, res.subpass_inputs, remap))
			continue;
	}

	for (auto &rename : args.interface_variable_renames)
	{
		if (rename.storageClass == StorageClassInput)
			spirv_cross_util::rename_interface_variable(*compiler, res.stage_inputs, rename.location,
			                                            rename.variable_name);
		else if (rename.storageClass == StorageClassOutput)
			spirv_cross_util::rename_interface_variable(*compiler, res.stage_outputs, rename.location,
			                                            rename.variable_name);
		else
		{
			fprintf(stderr, "error at --rename-interface-variable <in|out> ...\n");
			exit(EXIT_FAILURE);
		}
	}

	if (combined_image_samplers)
	{
		compiler->build_combined_image_samplers();
		if (args.combined_samplers_inherit_bindings)
			spirv_cross_util::inherit_combined_sampler_bindings(*compiler);

		// Give the remapped combined samplers new names.
		for (auto &remap : compiler->get_combined_image_samplers())
		{
			compiler->set_name(remap.combined_id, join("SPIRV_Cross_Combined", compiler->get_name(remap.image_id),
			                                           compiler->get_name(remap.sampler_id)));
		}
	}

	if (args.hlsl)
	{
		auto *hlsl_compiler = static_cast<CompilerHLSL *>(compiler.get());
		uint32_t new_builtin = hlsl_compiler->remap_num_workgroups_builtin();
		if (new_builtin)
		{
			hlsl_compiler->set_decoration(new_builtin, DecorationDescriptorSet, 0);
			hlsl_compiler->set_decoration(new_builtin, DecorationBinding, 0);
		}
	}

	if (args.hlsl)
	{
		for (auto &remap : args.hlsl_attr_remap)
			static_cast<CompilerHLSL *>(compiler.get())->add_vertex_attribute_remap(remap);
	}

	auto ret = compiler->compile();

	if (args.dump_resources)
	{
		print_resources(*compiler, res);
		print_push_constant_resources(*compiler, res.push_constant_buffers);
		print_spec_constants(*compiler);
		print_capabilities_and_extensions(*compiler);
	}

	return ret;
}